

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::ComputeAllConfigSources(cmGeneratorTarget *this)

{
  pointer pSVar1;
  cmSourceFile *pcVar2;
  cmSourceFile *pcVar3;
  _Base_ptr p_Var4;
  pointer pAVar5;
  iterator __position;
  KindedSources *pKVar6;
  _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_> _Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  pointer pSVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_bool> pVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  AllConfigSource acs;
  value_type entry;
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  unsigned_long local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  AllConfigSource local_98;
  pair<const_cmSourceFile_*const,_unsigned_long> local_70;
  _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  local_60;
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_b0,this->Makefile,IncludeEmptyConfig);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pKVar6 = GetKindedSources(this,local_b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_b8);
      pSVar1 = (pKVar6->Sources).
               super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar10 = (pKVar6->Sources).
                     super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar10 != pSVar1;
          pSVar10 = pSVar10 + 1) {
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00572cc9:
          local_98.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.Source = (pSVar10->Source).Value;
          local_98.Kind = pSVar10->Kind;
          std::
          vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
          ::emplace_back<cmGeneratorTarget::AllConfigSource>(&this->AllConfigSources,&local_98);
          local_70.second =
               ((long)(this->AllConfigSources).
                      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->AllConfigSources).
                      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1;
          local_70.first = (pSVar10->Source).Value;
          pVar11 = std::
                   _Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                   ::_M_emplace_unique<std::pair<cmSourceFile_const*const,unsigned_long>&>
                             ((_Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                               *)&local_60,&local_70);
          _Var7 = pVar11.first._M_node;
          if (local_98.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.Configs.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.Configs.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.Configs.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          pcVar2 = (pSVar10->Source).Value;
          _Var7._M_node = &local_60._M_impl.super__Rb_tree_header._M_header;
          p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            p_Var8 = p_Var4;
            p_Var9 = _Var7._M_node;
            pcVar3 = *(cmSourceFile **)(p_Var8 + 1);
            _Var7._M_node = p_Var8;
            if (pcVar3 < pcVar2) {
              _Var7._M_node = p_Var9;
            }
            p_Var4 = (&p_Var8->_M_left)[pcVar3 < pcVar2];
          } while ((&p_Var8->_M_left)[pcVar3 < pcVar2] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)_Var7._M_node == &local_60._M_impl.super__Rb_tree_header)
          goto LAB_00572cc9;
          if (pcVar3 < pcVar2) {
            p_Var8 = p_Var9;
          }
          if (pcVar2 < *(cmSourceFile **)(p_Var8 + 1)) goto LAB_00572cc9;
        }
        p_Var4 = _Var7._M_node[1]._M_parent;
        pAVar5 = (this->AllConfigSources).
                 super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current =
             *(pointer *)
              ((long)&pAVar5[(long)p_Var4].Configs.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
        ;
        if (__position._M_current ==
            *(pointer *)
             ((long)&pAVar5[(long)p_Var4].Configs.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
             0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &pAVar5[(long)p_Var4].Configs,__position,&local_b8);
        }
        else {
          *__position._M_current = local_b8;
          *(unsigned_long **)
           ((long)&pAVar5[(long)p_Var4].Configs.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               __position._M_current + 1;
        }
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 <
             (ulong)((long)local_b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeAllConfigSources() const
{
  std::vector<std::string> configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    KindedSources const& sources = this->GetKindedSources(configs[ci]);
    for (SourceAndKind const& src : sources.Sources) {
      auto mi = index.find(src.Source.Value);
      if (mi == index.end()) {
        AllConfigSource acs;
        acs.Source = src.Source.Value;
        acs.Kind = src.Kind;
        this->AllConfigSources.push_back(std::move(acs));
        std::map<cmSourceFile const*, size_t>::value_type entry(
          src.Source.Value, this->AllConfigSources.size() - 1);
        mi = index.insert(entry).first;
      }
      this->AllConfigSources[mi->second].Configs.push_back(ci);
    }
  }
}